

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TSymbol * __thiscall
glslang::HlslParseContext::lookupUserType(HlslParseContext *this,TString *typeName,TType *type)

{
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_01;
  TSymbol *symbol;
  TType *type_local;
  TString *typeName_local;
  HlslParseContext *this_local;
  
  pTVar2 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,typeName,(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if ((pTVar2 != (TSymbol *)0x0) &&
     (iVar1 = (*pTVar2->_vptr_TSymbol[9])(), CONCAT44(extraout_var,iVar1) != 0)) {
    iVar1 = (*pTVar2->_vptr_TSymbol[9])();
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xb0))();
    if ((uVar3 & 1) != 0) {
      iVar1 = (*pTVar2->_vptr_TSymbol[0xc])();
      TType::shallowCopy(type,(TType *)CONCAT44(extraout_var_01,iVar1));
      return pTVar2;
    }
  }
  return (TSymbol *)0x0;
}

Assistant:

TSymbol* HlslParseContext::lookupUserType(const TString& typeName, TType& type)
{
    TSymbol* symbol = symbolTable.find(typeName);
    if (symbol && symbol->getAsVariable() && symbol->getAsVariable()->isUserType()) {
        type.shallowCopy(symbol->getType());
        return symbol;
    } else
        return nullptr;
}